

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char  [7] __thiscall kj::str<char_const(&)[135]>(kj *this,char (*params) [135])

{
  size_t size;
  char (*result) [7];
  void *__dest;
  
  size = strlen(*params);
  heapString((String *)this,size);
  if (size != 0) {
    __dest = *(void **)(this + 8);
    if (__dest != (void *)0x0) {
      __dest = *(void **)this;
    }
    memcpy(__dest,params,size);
  }
  return SUB87(this,0);
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}